

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  Column_support *other_node;
  uint uVar1;
  int iVar2;
  pointer pIVar3;
  pointer plVar4;
  node_ptr plVar5;
  node_ptr *pplVar6;
  Index IVar7;
  Column_dimension_option CVar8;
  Field_operators *pFVar9;
  bool bVar10;
  node_ptr to_erase;
  reference value;
  long lVar11;
  const_node_ptr p;
  Column_support *pCVar12;
  node_ptr plVar13;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  undefined8 *puVar14;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  undefined4 local_294;
  undefined *local_290;
  undefined4 *local_288;
  undefined **local_280;
  undefined **local_278;
  char *local_270;
  shared_count sStack_268;
  char *local_260;
  undefined **local_258;
  ulong local_250;
  shared_count sStack_248;
  undefined4 **local_240;
  Delete_disposer local_238;
  undefined1 local_230;
  undefined8 *local_228;
  undefined ***local_220;
  char *local_218;
  char *local_210;
  shared_count sStack_208;
  undefined1 local_200 [16];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  col;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  moveCol;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  pIVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  col.super_Row_access_option.columnIndex_ = 6;
  col.super_Column_dimension_option.dim_ = (pIVar3->super_Column_dimension_option).dim_;
  col.operators_ = pIVar3->operators_;
  col.entryPool_ = pIVar3->entryPool_;
  other_node = &col.column_;
  puVar14 = *(undefined8 **)&(pIVar3->column_).super_type.data_.root_plus_size_;
  col.super_Row_access_option.rows_ = rows;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)other_node;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)other_node;
  while( true ) {
    if ((Column_support *)puVar14 == &pIVar3->column_) {
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      IVar7 = col.super_Row_access_option.columnIndex_;
      CVar8.dim_ = col.super_Column_dimension_option.dim_;
      pFVar9 = col.operators_;
      moveCol.entryPool_ = col.entryPool_;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        col.super_Row_access_option.columnIndex_ = IVar7;
        col.super_Column_dimension_option.dim_ = CVar8.dim_;
        col.operators_ = pFVar9;
        col.entryPool_ = moveCol.entryPool_;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_120 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_118 = "";
            local_130 = &boost::unit_test::basic_cstring<char_const>::null;
            local_128 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
            local_250 = local_250 & 0xffffffffffffff00;
            local_258 = &PTR__lazy_ostream_0024a430;
            sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_240 = (undefined4 **)0x2032e6;
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_288 = (undefined4 *)CONCAT44(local_288._4_4_,iVar2);
            local_290 = (undefined *)CONCAT44(local_290._4_4_,6);
            local_278 = (undefined **)CONCAT71(local_278._1_7_,iVar2 == 6);
            local_270 = (char *)0x0;
            sStack_268.pi_ = (sp_counted_base *)0x0;
            local_218 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_210 = "";
            local_200._0_8_ = &local_288;
            moveCol.super_Row_access_option.rows_ =
                 (Row_container *)
                 ((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
            moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0024a930;
            moveCol._16_8_ = &boost::unit_test::lazy_ostream::inst;
            moveCol.operators_ = (Field_operators *)local_200;
            local_280 = &local_290;
            local_230 = 0;
            local_238.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0024a6b0;
            local_228 = &boost::unit_test::lazy_ostream::inst;
            local_220 = &local_280;
            boost::test_tools::tt_detail::report_assertion
                      (&local_278,&local_258,&local_218,0x215,1,2,2,"entry.get_column_index()",
                       &moveCol,"6",&local_238);
            boost::detail::shared_count::~shared_count(&sStack_268);
          }
        }
        IVar7 = col.super_Row_access_option.columnIndex_;
        CVar8.dim_ = col.super_Column_dimension_option.dim_;
        pFVar9 = col.operators_;
        moveCol.entryPool_ = col.entryPool_;
      }
      col.super_Row_access_option.columnIndex_ = 0;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           (node_ptr)&moveCol.column_;
      moveCol.super_Row_access_option.columnIndex_ = IVar7;
      col.super_Column_dimension_option.dim_ = -1;
      moveCol.super_Column_dimension_option.dim_ = CVar8.dim_;
      col.operators_ = (Field_operators *)0x0;
      col.entryPool_ = (Entry_constructor *)0x0;
      moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
      moveCol.operators_ = pFVar9;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes(moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_,
                 (node_ptr)other_node);
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_38 = "";
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      local_48 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
      local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
      local_278 = &PTR__lazy_ostream_0024a430;
      sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_260 = "";
      local_290 = (undefined *)0xffffffffffffffff;
      plVar13 = (node_ptr)&moveCol.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        local_290 = local_290 + 1;
      } while (plVar13 != (node_ptr)&moveCol.column_);
      local_280 = &local_290;
      local_288 = &local_294;
      local_294 = 4;
      local_210 = (char *)0x0;
      sStack_208.pi_ = (sp_counted_base *)0x0;
      local_200._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_200._8_8_ = "";
      local_220 = &local_280;
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a3f0;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_240 = &local_288;
      local_250 = local_250 & 0xffffffffffffff00;
      local_258 = &PTR__lazy_ostream_0024a6b0;
      sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_218._0_1_ = local_290 == (undefined *)0x4;
      boost::test_tools::tt_detail::report_assertion
                (&local_218,&local_278,local_200,0x21c,1,2,2,"moveCol.size()",&local_238,"4",
                 &local_258);
      boost::detail::shared_count::~shared_count(&sStack_208);
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_58 = "";
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_68 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
      local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
      local_278 = &PTR__lazy_ostream_0024a430;
      sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_260 = "";
      lVar11 = 1;
      pCVar12 = other_node;
      do {
        pCVar12 = (Column_support *)
                  (pCVar12->super_type).data_.root_plus_size_.m_header.super_node.next_;
        lVar11 = lVar11 + -1;
      } while (pCVar12 != other_node);
      local_290 = (undefined *)-lVar11;
      local_294 = 0;
      local_218 = (char *)CONCAT71(local_218._1_7_,lVar11 == 0);
      local_210 = (char *)0x0;
      sStack_208.pi_ = (sp_counted_base *)0x0;
      local_200._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_200._8_8_ = "";
      local_280 = &local_290;
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a3f0;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_220 = &local_280;
      local_288 = &local_294;
      local_250 = local_250 & 0xffffffffffffff00;
      local_258 = &PTR__lazy_ostream_0024a6b0;
      sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_240 = &local_288;
      boost::test_tools::tt_detail::report_assertion
                (&local_218,&local_278,local_200,0x21d,1,2,2,"col.size()",&local_238,"0",&local_258)
      ;
      boost::detail::shared_count::~shared_count(&sStack_208);
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
      bVar10 = Gudhi::persistence_matrix::operator==
                         ((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,&moveCol);
      local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar10);
      local_250 = 0;
      sStack_248.pi_ = (sp_counted_base *)0x0;
      local_278 = (undefined **)0x20e775;
      local_270 = "";
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a378;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_98 = "";
      local_220 = &local_278;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_248);
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_140 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_138 = "";
            local_150 = &boost::unit_test::basic_cstring<char_const>::null;
            local_148 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                       &local_150);
            local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
            local_278 = &PTR__lazy_ostream_0024a430;
            sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_260 = "";
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_290 = (undefined *)CONCAT44(local_290._4_4_,iVar2);
            local_294 = 6;
            local_218 = (char *)CONCAT71(local_218._1_7_,iVar2 == 6);
            local_210 = (char *)0x0;
            sStack_208.pi_ = (sp_counted_base *)0x0;
            local_200._0_8_ =
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_200._8_8_ = "";
            local_280 = &local_290;
            local_230 = 0;
            local_238.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0024a930;
            local_228 = &boost::unit_test::lazy_ostream::inst;
            local_220 = &local_280;
            local_288 = &local_294;
            local_250 = local_250 & 0xffffffffffffff00;
            local_258 = &PTR__lazy_ostream_0024a6b0;
            sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_240 = &local_288;
            boost::test_tools::tt_detail::report_assertion
                      (&local_218,&local_278,local_200,0x22d,1,2,2,"entry.get_column_index()",
                       &local_238,"6",&local_258);
            boost::detail::shared_count::~shared_count(&sStack_208);
          }
        }
      }
      Gudhi::persistence_matrix::swap(&col,&moveCol);
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_a8 = "";
      local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
      local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
      local_278 = &PTR__lazy_ostream_0024a430;
      sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_260 = "";
      lVar11 = 1;
      plVar13 = (node_ptr)&moveCol.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        lVar11 = lVar11 + -1;
      } while (plVar13 != (node_ptr)&moveCol.column_);
      local_290 = (undefined *)-lVar11;
      local_294 = 0;
      local_210 = (char *)0x0;
      sStack_208.pi_ = (sp_counted_base *)0x0;
      local_200._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_200._8_8_ = "";
      local_280 = &local_290;
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a3f0;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_220 = &local_280;
      local_288 = &local_294;
      local_250 = local_250 & 0xffffffffffffff00;
      local_258 = &PTR__lazy_ostream_0024a6b0;
      sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_240 = &local_288;
      local_218._0_1_ = lVar11 == 0;
      boost::test_tools::tt_detail::report_assertion
                (&local_218,&local_278,local_200,0x234,1,2,2,"moveCol.size()",&local_238,"0",
                 &local_258);
      boost::detail::shared_count::~shared_count(&sStack_208);
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_c8 = "";
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
      local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
      local_278 = &PTR__lazy_ostream_0024a430;
      sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_260 = "";
      local_290 = (undefined *)0xffffffffffffffff;
      plVar13 = (node_ptr)&col.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        local_290 = local_290 + 1;
      } while (plVar13 != (node_ptr)&col.column_);
      local_294 = 4;
      local_218 = (char *)CONCAT71(local_218._1_7_,local_290 == (undefined *)0x4);
      local_210 = (char *)0x0;
      sStack_208.pi_ = (sp_counted_base *)0x0;
      local_200._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_200._8_8_ = "";
      local_280 = &local_290;
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a3f0;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_220 = &local_280;
      local_288 = &local_294;
      local_250 = local_250 & 0xffffffffffffff00;
      local_258 = &PTR__lazy_ostream_0024a6b0;
      sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_240 = &local_288;
      boost::test_tools::tt_detail::report_assertion
                (&local_218,&local_278,local_200,0x235,1,2,2,"col.size()",&local_238,"4",&local_258)
      ;
      boost::detail::shared_count::~shared_count(&sStack_208);
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
      bVar10 = Gudhi::persistence_matrix::operator==
                         ((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,&col);
      local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar10);
      local_250 = 0;
      sStack_248.pi_ = (sp_counted_base *)0x0;
      local_278 = (undefined **)0x20e78a;
      local_270 = "";
      local_230 = 0;
      local_238.col_ =
           (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0024a378;
      local_228 = &boost::unit_test::lazy_ostream::inst;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_108 = "";
      local_220 = &local_278;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_248);
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_160 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_158 = "";
            local_170 = &boost::unit_test::basic_cstring<char_const>::null;
            local_168 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                       &local_170);
            local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
            local_278 = &PTR__lazy_ostream_0024a430;
            sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_260 = "";
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_290 = (undefined *)CONCAT44(local_290._4_4_,iVar2);
            local_294 = 6;
            local_218 = (char *)CONCAT71(local_218._1_7_,iVar2 == 6);
            local_210 = (char *)0x0;
            sStack_208.pi_ = (sp_counted_base *)0x0;
            local_200._0_8_ =
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_200._8_8_ = "";
            local_280 = &local_290;
            local_230 = 0;
            local_238.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0024a930;
            local_228 = &boost::unit_test::lazy_ostream::inst;
            local_220 = &local_280;
            local_288 = &local_294;
            local_250 = local_250 & 0xffffffffffffff00;
            local_258 = &PTR__lazy_ostream_0024a6b0;
            sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_240 = &local_288;
            boost::test_tools::tt_detail::report_assertion
                      (&local_218,&local_278,local_200,0x245,1,2,2,"entry.get_column_index()",
                       &local_238,"6",&local_258);
            boost::detail::shared_count::~shared_count(&sStack_208);
          }
        }
      }
      local_238.col_ = &moveCol;
      if (moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
          (node_ptr)&moveCol.column_) {
        plVar13 = moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        do {
          plVar5 = plVar13->next_;
          plVar13->next_ = (node_ptr)0x0;
          plVar13->prev_ = (node_ptr)0x0;
          Gudhi::persistence_matrix::
          Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          ::Delete_disposer::operator()(&local_238,(Entry *)&plVar13[-2].prev_);
          plVar13 = plVar5;
        } while (plVar5 != (node_ptr)&moveCol.column_);
      }
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
      moveCol.super_Row_access_option._0_8_ = &col;
      if (col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
          (node_ptr)&col.column_) {
        plVar13 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        do {
          plVar5 = plVar13->next_;
          plVar13->next_ = (node_ptr)0x0;
          plVar13->prev_ = (node_ptr)0x0;
          Gudhi::persistence_matrix::
          Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          ::Delete_disposer::operator()((Delete_disposer *)&moveCol,(Entry *)&plVar13[-2].prev_);
          plVar13 = plVar5;
        } while (plVar5 != (node_ptr)&col.column_);
      }
      return;
    }
    uVar1 = *(uint *)(puVar14 + 2);
    value = (reference)operator_new(0x30);
    (value->super_Entry_column_index_option).columnIndex_ = col.super_Row_access_option.columnIndex_
    ;
    *(undefined8 *)&value->super_Entry_field_element_option = 0;
    *(undefined8 *)
     ((long)&(value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ + 4) = 0;
    *(undefined8 *)
     ((long)&(value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ + 4) = 0;
    *(undefined8 *)
     ((long)&(value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ + 4) = 0
    ;
    *(undefined4 *)
     ((long)&(value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ + 4) = 0
    ;
    value->rowIndex_ = uVar1;
    (value->super_Entry_field_element_option).element_ = *(uint *)((long)puVar14 + -0x14);
    if ((value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) break;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)other_node;
    pplVar6 = &(col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_;
    col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&value->super_Column_hook;
    *pplVar6 = (node_ptr)&value->super_Column_hook;
    if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
      if ((ulong)((long)((col.super_Row_access_option.rows_)->
                        super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((col.super_Row_access_option.rows_)->
                        super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(uVar1 + 1)) {
        std::
        vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
        ::resize(col.super_Row_access_option.rows_,(ulong)(uVar1 + 1));
      }
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
      ::push_back(&((col.super_Row_access_option.rows_)->
                   super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar1].super_type,value);
    }
    puVar14 = (undefined8 *)*puVar14;
  }
  __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                "/usr/include/boost/intrusive/list.hpp",0x33c,
                "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
               );
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}